

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O1

string * __thiscall
oout::FmtJunitXml::error(string *__return_storage_ptr__,FmtJunitXml *this,string *text)

{
  ostream *poVar1;
  ostringstream out;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"<error><![CDATA[",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]]></error>",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string error(const string &text) const override
	{
		ostringstream out;
		out << "<error><![CDATA[" << text << "]]></error>" << endl;
		return out.str();
	}